

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Metadata.cpp
# Opt level: O0

void __thiscall Assimp::X3DImporter::ParseNode_MetadataSet(X3DImporter *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  pointer pFVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar6;
  CX3DImporter_NodeElement_MetaSet *pCVar7;
  allocator local_f9;
  string local_f8;
  undefined4 local_d8;
  allocator local_d1;
  undefined1 local_d0 [8];
  string an;
  uint local_9c;
  int idx_end;
  int idx;
  CX3DImporter_NodeElement *ne;
  string reference;
  string name;
  string use;
  string def;
  X3DImporter *this_local;
  
  std::__cxx11::string::string((string *)(use.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(name.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(reference.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&ne);
  _idx_end = (CX3DImporter_NodeElement_MetaSet *)0x0;
  local_9c = 0;
  pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  for (; (int)local_9c < iVar2; local_9c = local_9c + 1) {
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar5,(ulong)local_9c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_d0,(char *)CONCAT44(extraout_var,iVar3),&local_d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_d0,"DEF");
    if (bVar1) {
      pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                        (pFVar5,(ulong)local_9c);
      std::__cxx11::string::operator=
                ((string *)(use.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_00,iVar3));
      local_d8 = 4;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_d0,"USE");
      if (bVar1) {
        pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                          (pFVar5,(ulong)local_9c);
        std::__cxx11::string::operator=
                  ((string *)(name.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_01,iVar3)
                  );
        local_d8 = 4;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_d0,"bboxCenter");
        if (bVar1) {
          local_d8 = 4;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0,"bboxSize");
          if (bVar1) {
            local_d8 = 4;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_d0,"containerField");
            if (bVar1) {
              local_d8 = 4;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_d0,"name");
              if (bVar1) {
                pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                         operator->(&this->mReader);
                iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader
                          [6])(pFVar5,(ulong)local_9c);
                std::__cxx11::string::operator=
                          ((string *)(reference.field_2._M_local_buf + 8),
                           (char *)CONCAT44(extraout_var_02,iVar3));
                local_d8 = 4;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_d0,"reference");
                if (bVar1) {
                  pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                           ::operator->(&this->mReader);
                  iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>).
                            _vptr_IIrrXMLReader[6])(pFVar5,(ulong)local_9c);
                  std::__cxx11::string::operator=
                            ((string *)&ne,(char *)CONCAT44(extraout_var_03,iVar3));
                  local_d8 = 4;
                }
                else {
                  Throw_IncorrectAttr(this,(string *)local_d0);
                  local_d8 = 0;
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_d0);
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    XML_CheckNode_MustBeEmpty(this);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      Throw_DEF_And_USE(this);
    }
    bVar1 = FindNodeElement(this,(string *)((long)&name.field_2 + 8),ENET_MetaSet,
                            (CX3DImporter_NodeElement **)&idx_end);
    if (!bVar1) {
      Throw_USE_NotFound(this,(string *)((long)&name.field_2 + 8));
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
  }
  else {
    pCVar7 = (CX3DImporter_NodeElement_MetaSet *)operator_new(0xa8);
    CX3DImporter_NodeElement_MetaSet::CX3DImporter_NodeElement_MetaSet(pCVar7,this->NodeElement_Cur)
    ;
    _idx_end = pCVar7;
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)
                 &(_idx_end->super_CX3DImporter_NodeElement_Meta).super_CX3DImporter_NodeElement.ID,
                 (string *)(use.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::operator=
              ((string *)&(_idx_end->super_CX3DImporter_NodeElement_Meta).Reference,(string *)&ne);
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    uVar4 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pCVar7 = _idx_end;
    if ((uVar4 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f8,"MetadataSet",&local_f9);
      ParseNode_Metadata(this,(CX3DImporter_NodeElement *)pCVar7,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    }
    else {
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_List,(value_type *)&idx_end);
  }
  std::__cxx11::string::~string((string *)&ne);
  std::__cxx11::string::~string((string *)(reference.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(use.field_2._M_local_buf + 8));
  return;
}

Assistant:

void X3DImporter::ParseNode_MetadataSet()
{
    std::string def, use;
    std::string name, reference;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("name", name, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_RET("reference", reference, mReader->getAttributeValue);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_MetaSet, ne);
	}
	else
	{
		ne = new CX3DImporter_NodeElement_MetaSet(NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		((CX3DImporter_NodeElement_MetaSet*)ne)->Reference = reference;
		// also metadata node can contain childs
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "MetadataSet");
		else
			NodeElement_Cur->Child.push_back(ne);// made object as child to current element

		NodeElement_List.push_back(ne);// add new element to elements list.
	}// if(!use.empty()) else
}